

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void bluntify(void)

{
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> this;
  EdgesIterator EVar4;
  pair<std::_Rb_tree_const_iterator<std::pair<long,_long>_>,_bool> pVar5;
  long right_neighbour_id_1;
  EdgesIterator __end5;
  EdgesIterator __begin5;
  Edges *__range5;
  long expanded_node_id;
  Node *to_node;
  Node *from_node;
  long node_right_edge_size;
  long left_neighbour_right_edge_size;
  Node *left_neighbour;
  long left_neighbour_id;
  EdgesIterator __end3_1;
  EdgesIterator __begin3_1;
  Edges *__range3_1;
  Edges left_edges;
  long right_neighbour_id;
  EdgesIterator __end3;
  EdgesIterator __begin3;
  Edges *__range3;
  Edges right_edges;
  long new_right_node_id;
  Node *node_1;
  long i_1;
  long node_last_id;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  good_edges;
  int to;
  int from;
  Node *node;
  long i;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  _Rb_tree_const_iterator<std::pair<long,_long>_> in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  pair<long,_long> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  Edges *in_stack_fffffffffffffc88;
  char cVar6;
  Node *in_stack_fffffffffffffc90;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> in_stack_fffffffffffffc98;
  int sequence_len;
  char from_side;
  char *in_stack_fffffffffffffca0;
  long local_348;
  Node *in_stack_fffffffffffffcc0;
  Node *pNVar7;
  bool local_319;
  long local_280;
  pair<long,_long> local_278;
  _Base_ptr local_268;
  undefined1 local_260;
  long local_258;
  pair<long,_long> local_250;
  pair<long,_long> *local_240;
  Edges *local_238;
  int local_230;
  EdgesIterator local_228;
  Edges *local_218;
  int local_210;
  EdgesIterator local_208;
  Edges *local_1f8;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_1f0;
  char *local_1e8;
  Node *local_1e0;
  Node *local_1d8;
  long local_1d0;
  Node *local_1c8;
  long local_1c0;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_1b8;
  Node *local_1b0;
  _Self local_1a8;
  long local_1a0;
  pair<long,_long> local_198;
  _Self local_188;
  long local_180;
  Edges *local_178;
  int local_170;
  EdgesIterator local_168;
  Edges *local_158;
  int local_150;
  EdgesIterator local_148;
  undefined1 *local_138;
  undefined1 local_130 [24];
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_118;
  long local_110;
  Edges *local_108;
  int local_100;
  EdgesIterator local_f8;
  Edges *local_e8;
  int local_e0;
  EdgesIterator local_d8;
  undefined1 *local_c8;
  undefined1 local_c0 [24];
  long local_a8;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_a0;
  Node *local_98;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_90 [3];
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_78;
  long local_70;
  long local_68;
  int local_30;
  int local_2c;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_28;
  Node *local_20;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_18;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_10;
  long local_8;
  
  Logger::debug(logger,"bluntifying graph");
  for (local_8 = 1; local_8 <= Node::last_id; local_8 = local_8 + 1) {
    local_10._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
         ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                (key_type *)0x1034b7);
    local_18._M_cur =
         (__node_type *)
         std::
         unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
         ::end((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    bVar1 = std::__detail::operator==(&local_10,&local_18);
    if (!bVar1) {
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
           ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                  (key_type *)0x103507);
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x10351c);
      local_20 = &ppVar2->second;
      bVar1 = Edges::empty((Edges *)0x103539);
      if (bVar1) {
        local_2c = 0;
      }
      else {
        local_2c = (k + -1) / 2;
      }
      bVar1 = Edges::empty((Edges *)0x103573);
      pNVar7 = local_20;
      if (bVar1) {
        local_30 = local_20->sequence_len;
      }
      else {
        local_30 = local_20->sequence_len - k / 2;
      }
      pcVar3 = Node::get_sequence(local_20);
      Node::set_sequence(pNVar7,pcVar3 + local_2c,local_30 - local_2c);
    }
  }
  if (k % 2 == 0) {
    std::
    set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
           *)0x103640);
    local_68 = Node::last_id;
    for (local_70 = 1; local_70 <= local_68; local_70 = local_70 + 1) {
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
           ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                  (key_type *)0x103688);
      local_90[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
           ::end((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                  *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      bVar1 = std::__detail::operator==(&local_78,local_90);
      if (!bVar1) {
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
             ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                    (key_type *)0x103703);
        ppVar2 = std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x10372a);
        local_98 = &ppVar2->second;
        local_a8 = 0;
        Edges::Edges((Edges *)in_stack_fffffffffffffc50._M_node,
                     (Edges *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        local_c8 = local_c0;
        EVar4 = Edges::begin((Edges *)0x10377a);
        local_e8 = EVar4.edges;
        local_e0 = EVar4.index;
        local_d8.edges = local_e8;
        local_d8.index = local_e0;
        EVar4 = Edges::end((Edges *)0x1037d4);
        local_108 = EVar4.edges;
        local_100 = EVar4.index;
        local_f8.edges = local_108;
        local_f8.index = local_100;
        while (bVar1 = Edges::EdgesIterator::operator!=(&local_d8,&local_f8), bVar1) {
          local_110 = Edges::EdgesIterator::operator*((EdgesIterator *)0x10385c);
          if (0 < local_110) {
            if (local_a8 == 0) {
              Node::get_sequence(local_98);
              local_a8 = Node::add_node(in_stack_fffffffffffffca0,
                                        (int)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x20),
                                        (long)in_stack_fffffffffffffc90,
                                        (long)in_stack_fffffffffffffc88);
              Node::add_edge((long)in_stack_fffffffffffffca0,
                             (char)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x38),
                             (long)in_stack_fffffffffffffc90,
                             (char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
            }
            Edges::erase((Edges *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (long)in_stack_fffffffffffffc68);
            local_118._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                 ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                         *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                        (key_type *)0x103958);
            std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator->
                      ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x10397f);
            Edges::erase((Edges *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (long)in_stack_fffffffffffffc68);
            Node::add_edge((long)in_stack_fffffffffffffca0,
                           (char)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x38),
                           (long)in_stack_fffffffffffffc90,
                           (char)((ulong)in_stack_fffffffffffffc88 >> 0x38));
          }
          Edges::EdgesIterator::operator++(&local_d8);
        }
        Edges::Edges((Edges *)in_stack_fffffffffffffc50._M_node,
                     (Edges *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        local_138 = local_130;
        EVar4 = Edges::begin((Edges *)0x103a09);
        local_158 = EVar4.edges;
        local_150 = EVar4.index;
        local_148.edges = local_158;
        local_148.index = local_150;
        EVar4 = Edges::end((Edges *)0x103a63);
        local_178 = EVar4.edges;
        local_170 = EVar4.index;
        local_168.edges = local_178;
        local_168.index = local_170;
        while (bVar1 = Edges::EdgesIterator::operator!=(&local_148,&local_168), bVar1) {
          local_180 = Edges::EdgesIterator::operator*((EdgesIterator *)0x103aeb);
          local_319 = false;
          if (local_180 < 0) {
            local_1a0 = -local_180;
            std::pair<long,_long>::pair<long,_long_&,_true>(&local_198,&local_1a0,&local_98->id);
            local_188._M_node =
                 (_Base_ptr)
                 std::
                 set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                 ::find((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                        in_stack_fffffffffffffc50._M_node);
            local_1a8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                 ::end((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
            local_319 = std::operator==(&local_188,&local_1a8);
          }
          if (local_319 != false) {
            local_1c0 = -local_180;
            this._M_cur = (__node_type *)
                          std::
                          unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                          ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                                 (key_type *)0x103be6);
            local_1b8._M_cur = this._M_cur;
            ppVar2 = std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::
                     operator->((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)
                                0x103c0d);
            local_1b0 = &ppVar2->second;
            Edges::erase((Edges *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (long)in_stack_fffffffffffffc68);
            Edges::erase((Edges *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         (long)in_stack_fffffffffffffc68);
            if (local_1b0->sequence_len < 2) {
              in_stack_fffffffffffffcc0 = (Node *)Edges::size((Edges *)0x103c83);
              pNVar7 = in_stack_fffffffffffffcc0;
            }
            else {
              pNVar7 = (Node *)0x1;
            }
            local_1c8 = pNVar7;
            if (local_98->sequence_len < 2) {
              local_348 = Edges::size((Edges *)0x103cd4);
            }
            else {
              local_348 = 1;
            }
            sequence_len = (int)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x20);
            local_1d0 = local_348;
            if ((local_1c8 != (Node *)0x0) && (local_348 != 0)) {
              if ((long)local_1c8 < local_348) {
                local_1d8 = local_1b0;
                local_1e0 = local_98;
              }
              else {
                local_1d8 = local_98;
                local_1e0 = local_1b0;
              }
              if (1 < local_1d8->sequence_len) {
                Node::get_sequence(local_1d8);
                in_stack_fffffffffffffca0 =
                     (char *)Node::add_node(in_stack_fffffffffffffca0,sequence_len,
                                            (long)in_stack_fffffffffffffc90,
                                            (long)in_stack_fffffffffffffc88);
                cVar6 = (char)((ulong)in_stack_fffffffffffffc88 >> 0x38);
                local_1d8->sequence_len = 1;
                in_stack_fffffffffffffc90 = local_1d8;
                local_1e8 = in_stack_fffffffffffffca0;
                in_stack_fffffffffffffc98._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                     ::find((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                             *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                            (key_type *)0x103e14);
                local_1f0._M_cur = in_stack_fffffffffffffc98._M_cur;
                std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator->
                          ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x103e35);
                Node::move_right_edges_to
                          ((Node *)this._M_cur,pNVar7,
                           SUB81((ulong)in_stack_fffffffffffffcc0 >> 0x38,0));
                Node::add_edge((long)in_stack_fffffffffffffca0,
                               (char)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x38),
                               (long)in_stack_fffffffffffffc90,cVar6);
              }
              local_1f8 = &local_1d8->right_edges;
              EVar4 = Edges::begin((Edges *)0x103e91);
              in_stack_fffffffffffffc88 = EVar4.edges;
              local_210 = EVar4.index;
              local_218 = in_stack_fffffffffffffc88;
              local_208.edges = in_stack_fffffffffffffc88;
              local_208.index = local_210;
              EVar4 = Edges::end((Edges *)0x103edf);
              local_238 = EVar4.edges;
              in_stack_fffffffffffffc74 = EVar4.index;
              local_230 = in_stack_fffffffffffffc74;
              local_228.edges = local_238;
              local_228.index = in_stack_fffffffffffffc74;
              while( true ) {
                bVar1 = Edges::EdgesIterator::operator!=(&local_208,&local_228);
                in_stack_fffffffffffffc70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc70);
                if (!bVar1) break;
                in_stack_fffffffffffffc68 =
                     (pair<long,_long> *)Edges::EdgesIterator::operator*((EdgesIterator *)0x103f55);
                cVar6 = (char)((ulong)in_stack_fffffffffffffc88 >> 0x38);
                from_side = (char)((ulong)in_stack_fffffffffffffc98._M_cur >> 0x38);
                local_240 = in_stack_fffffffffffffc68;
                if ((long)in_stack_fffffffffffffc68 < 0) {
                  Node::add_edge((long)in_stack_fffffffffffffca0,from_side,
                                 (long)in_stack_fffffffffffffc90,cVar6);
                  local_258 = -(long)local_240;
                  std::pair<long,_long>::pair<long,_long_&,_true>
                            (&local_250,&local_258,&local_1e0->id);
                  pVar5 = std::
                          set<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                          ::emplace<std::pair<long,long>>
                                    ((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc68);
                  local_268 = (_Base_ptr)pVar5.first._M_node;
                  in_stack_fffffffffffffc5f = pVar5.second;
                  local_280 = -(long)local_240;
                  local_260 = in_stack_fffffffffffffc5f;
                  std::pair<long,_long>::pair<long_&,_long,_true>
                            (&local_278,&local_1e0->id,&local_280);
                  pVar5 = std::
                          set<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                          ::emplace<std::pair<long,long>>
                                    ((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc68);
                  in_stack_fffffffffffffc50 = pVar5.first._M_node;
                  in_stack_fffffffffffffc4f = pVar5.second;
                }
                else {
                  Node::add_edge((long)in_stack_fffffffffffffca0,from_side,
                                 (long)in_stack_fffffffffffffc90,cVar6);
                }
                Edges::EdgesIterator::operator++(&local_208);
              }
            }
          }
          Edges::EdgesIterator::operator++(&local_148);
        }
        Edges::~Edges((Edges *)0x1040d3);
        Edges::~Edges((Edges *)0x1040e0);
      }
    }
    std::
    set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::~set((set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
            *)0x104115);
  }
  return;
}

Assistant:

void bluntify() {
    logger->debug("bluntifying graph");
    for (long i = 1; i <= Node::last_id; ++i) {
        if (Node::nodes.find(i) == Node::nodes.end())
            continue;
        Node &node = Node::nodes.find(i)->second;
        int from, to;
        if (!node.left_edges.empty())
            from = (k - 1) / 2;
        else
            from = 0;
        if (!node.right_edges.empty())
            to = node.sequence_len - k / 2;
        else
            to = node.sequence_len;
        node.set_sequence(node.get_sequence() + from, to - from);
    }
    if (k % 2 == 0) {
        set<pair<long, long>> good_edges;
        long node_last_id = Node::last_id;
        for (long i = 1; i <= node_last_id; ++i) {
            if (Node::nodes.find(i) == Node::nodes.end())
                continue;
            Node &node = Node::nodes.find(i)->second;
            long new_right_node_id = 0;
            auto right_edges = node.right_edges;
            for (long right_neighbour_id : right_edges) {
                if (right_neighbour_id > 0) {
                    if (new_right_node_id == 0) {
                        new_right_node_id = Node::add_node(node.get_sequence() + node.sequence_len, 1);
                        Node::add_edge(node.id, '+', new_right_node_id, '+');
                    }
                    node.right_edges.erase(right_neighbour_id);
                    Node::nodes.find(right_neighbour_id)->second.right_edges.erase(node.id);
                    Node::add_edge(new_right_node_id, '+', right_neighbour_id, '-');
                }
            }
            auto left_edges = node.left_edges;
            for (long left_neighbour_id : left_edges)
                if (left_neighbour_id < 0 &&
                    good_edges.find(pair<long, long>(-1 * left_neighbour_id, node.id)) == good_edges.end()) {
                    Node &left_neighbour = Node::nodes.find(-1 * left_neighbour_id)->second;
                    node.left_edges.erase(left_neighbour_id);
                    left_neighbour.left_edges.erase(node.id * -1);
                    long left_neighbour_right_edge_size =
                            left_neighbour.sequence_len > 1 ? 1 : left_neighbour.right_edges.size();
                    long node_right_edge_size = node.sequence_len > 1 ? 1 : node.right_edges.size();
                    if (left_neighbour_right_edge_size == 0 || node_right_edge_size == 0)
                        continue;
                    Node *from_node, *to_node;
                    if (left_neighbour_right_edge_size < node_right_edge_size) {
                        from_node = &left_neighbour;
                        to_node = &node;
                    } else {
                        from_node = &node;
                        to_node = &left_neighbour;
                    }
                    if (from_node->sequence_len > 1) {
                        long expanded_node_id = Node::add_node(from_node->get_sequence() + 1,
                                                               from_node->sequence_len - 1);
                        from_node->sequence_len = 1;
                        from_node->move_right_edges_to(Node::nodes.find(expanded_node_id)->second);
                        Node::add_edge(from_node->id, '+', expanded_node_id, '+');
                    }
                    for (long right_neighbour_id : from_node->right_edges)
                        if (right_neighbour_id < 0) {
                            Node::add_edge(-1 * right_neighbour_id, '-', to_node->id, '+');
                            good_edges.emplace(pair<long, long>(-1 * right_neighbour_id, to_node->id));
                            good_edges.emplace(pair<long, long>(to_node->id, -1 * right_neighbour_id));
                        } else
                            Node::add_edge(right_neighbour_id, '+', to_node->id, '+');
                }
        }
    }
}